

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O3

void sysbvm_identitySet_increaseCapacity(sysbvm_context_t *context,sysbvm_tuple_t set)

{
  undefined8 *puVar1;
  ulong uVar2;
  sysbvm_tuple_t sVar3;
  intptr_t iVar4;
  sysbvm_tuple_t sVar5;
  ulong uVar6;
  sysbvm_tuple_t sVar7;
  ulong uVar8;
  
  uVar2 = *(ulong *)(set + 0x18);
  if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
    uVar6 = (ulong)(*(uint *)(uVar2 + 0xc) >> 3);
  }
  else {
    uVar6 = 0;
  }
  uVar8 = (ulong)(uint)((int)uVar6 * 2);
  sVar7 = 8;
  if (8 < uVar8) {
    sVar7 = uVar8;
  }
  sVar3 = sysbvm_array_create(context,sVar7);
  *(sysbvm_tuple_t *)(set + 0x18) = sVar3;
  sVar5 = 0;
  do {
    puVar1 = (undefined8 *)(sVar3 + 0x10 + sVar5 * 8);
    *puVar1 = 0x3f;
    puVar1[1] = 0x3f;
    sVar5 = sVar5 + 2;
  } while (sVar7 != sVar5);
  if (uVar6 != 0) {
    uVar8 = 0;
    do {
      sVar7 = *(sysbvm_tuple_t *)(uVar2 + 0x10 + uVar8 * 8);
      if (sVar7 != 0x3f) {
        iVar4 = sysbvm_identitySet_scanFor(set,sVar7);
        if (iVar4 < 0) {
          sysbvm_error_assertionFailure
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/set.c:109: assertion failure: elementIndex >= 0"
                    );
        }
        *(sysbvm_tuple_t *)(*(long *)(set + 0x18) + 0x10 + iVar4 * 8) = sVar7;
      }
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  return;
}

Assistant:

static void sysbvm_identitySet_increaseCapacity(sysbvm_context_t *context, sysbvm_tuple_t set)
{
    sysbvm_identitySet_t *setObject = (sysbvm_identitySet_t*)set;
    sysbvm_array_t *oldStorage = (sysbvm_array_t*)setObject->storage;

    size_t oldCapacity = sysbvm_tuple_getSizeInSlots(setObject->storage);
    size_t newCapacity = oldCapacity * 2;
    if(newCapacity < 8)
        newCapacity = 8;

    // Make the new storage.
    sysbvm_array_t *newStorage = (sysbvm_array_t*)sysbvm_array_create(context, newCapacity);
    setObject->storage = (sysbvm_tuple_t)newStorage;
    for(size_t i = 0; i < newCapacity; ++i)
        newStorage->elements[i] = SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE;

    // Reinsert the old elements.
    for(size_t i = 0; i < oldCapacity; ++i)
    {
        sysbvm_tuple_t element = oldStorage->elements[i];
        if(element != SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE)
            sysbvm_identitySet_insertNoCheck(set, element);
    }
}